

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O3

InputVertexId __thiscall S2Builder::AddVertex(S2Builder *this,S2Point *v)

{
  double dVar1;
  double dVar2;
  VType VVar3;
  long lVar4;
  double *ap;
  iterator __position;
  bool bVar5;
  
  __position._M_current =
       (this->input_vertices_).
       super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if ((this->input_vertices_).super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>
      ._M_impl.super__Vector_impl_data._M_start != __position._M_current) {
    lVar4 = 0;
    do {
      dVar1 = *(double *)((long)v->c_ + lVar4);
      dVar2 = *(double *)((long)__position._M_current[-1].c_ + lVar4);
      if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
      bVar5 = lVar4 != 0x10;
      lVar4 = lVar4 + 8;
    } while (bVar5);
    if ((dVar1 == dVar2) && (!NAN(dVar1) && !NAN(dVar2))) goto LAB_001a8d65;
  }
  if (__position._M_current ==
      (this->input_vertices_).super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Vector3<double>,std::allocator<Vector3<double>>>::
    _M_realloc_insert<Vector3<double>const&>
              ((vector<Vector3<double>,std::allocator<Vector3<double>>> *)&this->input_vertices_,
               __position,v);
    __position._M_current =
         (this->input_vertices_).
         super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    (__position._M_current)->c_[2] = v->c_[2];
    VVar3 = v->c_[1];
    (__position._M_current)->c_[0] = v->c_[0];
    (__position._M_current)->c_[1] = VVar3;
    __position._M_current =
         (this->input_vertices_).
         super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
    (this->input_vertices_).super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = __position._M_current;
  }
LAB_001a8d65:
  return (int)((ulong)((long)__position._M_current -
                      (long)(this->input_vertices_).
                            super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>.
                            _M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555 + -1;
}

Assistant:

S2Builder::InputVertexId S2Builder::AddVertex(const S2Point& v) {
  // Remove duplicate vertices that follow the pattern AB, BC, CD.  If we want
  // to do anything more sophisticated, either use a ValueLexicon, or sort the
  // vertices once they have all been added, remove duplicates, and update the
  // edges.
  if (input_vertices_.empty() || v != input_vertices_.back()) {
    input_vertices_.push_back(v);
  }
  return input_vertices_.size() - 1;
}